

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TernaryExpression.hpp
# Opt level: O3

void __thiscall
Kandinsky::TernaryExpression::fillVariableSet
          (TernaryExpression *this,
          set<Kandinsky::Variable,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
          *variableSet,BaseExpressionPtr *param_2)

{
  element_type *peVar1;
  
  peVar1 = (this->m_arg1).super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar1->_vptr_BaseExpression[4])(peVar1,variableSet,&this->m_arg1);
  peVar1 = (this->m_arg2).super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar1->_vptr_BaseExpression[4])(peVar1,variableSet,&this->m_arg2);
  peVar1 = (this->m_arg3).super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar1->_vptr_BaseExpression[4])(peVar1,variableSet,&this->m_arg3);
  return;
}

Assistant:

virtual void fillVariableSet(std::set<Variable, VariableLessThanComparator>& variableSet, const BaseExpressionPtr& /*thisSharedPtr*/) const
        {
            m_arg1->fillVariableSet(variableSet, m_arg1);
            m_arg2->fillVariableSet(variableSet, m_arg2);
            m_arg3->fillVariableSet(variableSet, m_arg3);
        }